

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall ktxValidator::validationContext::createDfd4Format(validationContext *this)

{
  int iVar1;
  undefined8 uVar2;
  long in_RDI;
  
  iVar1 = *(int *)(in_RDI + 0x14);
  if (iVar1 == 0x80) {
    uVar2 = createDFDDepthStencil(0x10,8,4);
    *(undefined8 *)(in_RDI + 0x70) = uVar2;
  }
  else if (iVar1 == 0x81) {
    uVar2 = createDFDDepthStencil(0x18,8,4);
    *(undefined8 *)(in_RDI + 0x70) = uVar2;
  }
  else if (iVar1 == 0x82) {
    uVar2 = createDFDDepthStencil(0x20,8);
    *(undefined8 *)(in_RDI + 0x70) = uVar2;
  }
  else {
    uVar2 = vk2dfd(*(undefined4 *)(in_RDI + 0x14));
    *(undefined8 *)(in_RDI + 0x70) = uVar2;
  }
  return;
}

Assistant:

void createDfd4Format()
        {
            switch(header.vkFormat) {
              case VK_FORMAT_D16_UNORM_S8_UINT:
                // 2 16-bit words. D16 in the first. S8 in the 8 LSBs of the second.
                pDfd4Format = createDFDDepthStencil(16, 8, 4);
                break;
              case VK_FORMAT_D24_UNORM_S8_UINT:
                // 1 32-bit word. D24 in the MSBs. S8 in the LSBs.
                pDfd4Format = createDFDDepthStencil(24, 8, 4);
                break;
              case VK_FORMAT_D32_SFLOAT_S8_UINT:
                // 2 32-bit words. D32 float in the first word. S8 in LSBs of the
                // second.
                pDfd4Format = createDFDDepthStencil(32, 8, 8);
                break;
              default:
                pDfd4Format = vk2dfd((VkFormat)header.vkFormat);
            }
        }